

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseCallOffset(State *state)

{
  bool bVar1;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *state_00;
  undefined8 uVar2;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    state_00 = *(State **)&local_10->parse_state;
    uVar2 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    bVar1 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar2 >> 0x38));
    if (((bVar1) && (bVar1 = ParseNVOffset(state_00), bVar1)) &&
       (bVar1 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar2 >> 0x38)), bVar1)) {
      local_1 = 1;
    }
    else {
      *(State **)&local_10->parse_state = state_00;
      *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar2;
      bVar1 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar2 >> 0x38));
      if (((bVar1) && (bVar1 = ParseVOffset(in_stack_ffffffffffffffd8), bVar1)) &&
         (bVar1 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar2 >> 0x38)), bVar1))
      {
        local_1 = 1;
      }
      else {
        *(State **)&local_10->parse_state = state_00;
        *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar2;
        local_1 = 0;
      }
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseCallOffset(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'h') && ParseNVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'v') && ParseVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}